

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParamIterator<const_char_*> * __thiscall
testing::internal::ParamIterator<const_char_*>::operator=
          (ParamIterator<const_char_*> *this,ParamIterator<const_char_*> *other)

{
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_false> _Var1;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_false> _Var2;
  undefined4 extraout_var;
  
  if (this != other) {
    _Var2._M_head_impl._0_4_ =
         (*((other->impl_)._M_t.
            super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_char_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_char_*>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_char_*>_>_>
            .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_false>
           ._M_head_impl)->_vptr_ParamIteratorInterface[4])();
    _Var2._M_head_impl._4_4_ = extraout_var;
    _Var1._M_head_impl =
         (this->impl_)._M_t.
         super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_char_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_char_*>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_char_*>_>_>
         .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_false>.
         _M_head_impl;
    (this->impl_)._M_t.
    super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_char_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_char_*>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_char_*>_>_>
    .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_char_*>_*,_false>.
    _M_head_impl = _Var2._M_head_impl;
    if (_Var1._M_head_impl != (ParamIteratorInterface<const_char_*> *)0x0) {
      (*(_Var1._M_head_impl)->_vptr_ParamIteratorInterface[1])();
    }
  }
  return this;
}

Assistant:

ParamIterator& operator=(const ParamIterator& other) {
    if (this != &other) impl_.reset(other.impl_->Clone());
    return *this;
  }